

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  ZSTD_matchState_t *pZVar4;
  seqStore_t *psVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  U32 UVar9;
  size_t sVar10;
  BYTE *pBVar11;
  int *mEnd;
  BYTE *pBVar12;
  BYTE *pBVar13;
  int *piVar14;
  size_t sVar15;
  long lVar16;
  int *piVar17;
  seqDef *psVar18;
  uint uVar19;
  int *iEnd;
  ulong uVar20;
  U32 UVar21;
  size_t offsetFound;
  U32 local_e0;
  size_t local_d8;
  size_t local_d0;
  ulong local_c8;
  U32 local_bc;
  int *local_b8;
  int *local_b0;
  BYTE *local_a8;
  ZSTD_matchState_t *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  ulong local_88;
  int *local_80;
  int *local_78;
  ulong local_70;
  seqStore_t *local_68;
  uint local_5c;
  int *local_58;
  int *local_50;
  U32 *local_48;
  BYTE *local_40;
  int *local_38;
  
  iEnd = (int *)((long)src + srcSize);
  local_b8 = (int *)((long)src + (srcSize - 8));
  local_90 = (ms->window).base;
  uVar7 = (ms->window).dictLimit;
  local_c8 = (ulong)uVar7;
  local_a8 = local_90 + local_c8;
  local_e0 = *rep;
  UVar21 = rep[1];
  piVar17 = (int *)((ulong)(local_a8 == (BYTE *)src) + (long)src);
  local_48 = rep;
  if (piVar17 < local_b8) {
    local_98 = (ms->window).dictBase;
    local_70 = (ulong)(ms->window).lowLimit;
    local_80 = (int *)(local_98 + local_c8);
    local_40 = local_98 + local_70;
    iVar6 = uVar7 - 1;
    local_50 = iEnd + -8;
    local_a0 = ms;
    local_68 = seqStore;
    local_58 = iEnd;
    do {
      uVar7 = (int)piVar17 - (int)local_90;
      local_88 = (ulong)uVar7;
      uVar7 = (uVar7 - local_e0) + 1;
      pBVar12 = local_90;
      if (uVar7 < (uint)local_c8) {
        pBVar12 = local_98;
      }
      local_78 = (int *)src;
      if (((uint)local_70 < uVar7 && 2 < iVar6 - uVar7) &&
         (*(int *)((long)piVar17 + 1) == *(int *)(pBVar12 + uVar7))) {
        piVar14 = iEnd;
        if (uVar7 < (uint)local_c8) {
          piVar14 = local_80;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar17 + 5),(BYTE *)((long)(pBVar12 + uVar7) + 4),
                            (BYTE *)iEnd,(BYTE *)piVar14,local_a8);
        uVar20 = sVar10 + 4;
      }
      else {
        uVar20 = 0;
      }
      local_d0 = 999999999;
      sVar10 = ZSTD_BtFindBestMatch_extDict_selectMLS
                         (local_a0,(BYTE *)piVar17,(BYTE *)iEnd,&local_d0);
      iEnd = local_58;
      local_d8 = uVar20;
      if (uVar20 < sVar10) {
        local_d8 = sVar10;
      }
      if (local_d8 < 4) {
        src = local_78;
        piVar17 = (int *)((long)piVar17 + ((long)piVar17 - (long)local_78 >> 8) + 1);
      }
      else {
        local_b0 = piVar17;
        sVar15 = local_d0;
        if (sVar10 <= uVar20) {
          local_b0 = (int *)((long)piVar17 + 1);
          sVar15 = 0;
        }
        uVar20 = local_88;
        local_bc = UVar21;
        if (piVar17 < local_b8) {
          do {
            pZVar4 = local_a0;
            piVar14 = (int *)((long)piVar17 + 1);
            local_5c = (int)uVar20 + 1;
            local_88 = uVar20;
            local_38 = piVar17;
            if (sVar15 == 0) {
              sVar15 = 0;
            }
            else {
              uVar7 = local_5c - local_e0;
              pBVar12 = local_90;
              if (uVar7 < (uint)local_c8) {
                pBVar12 = local_98;
              }
              if (((uint)local_70 < uVar7 && 2 < iVar6 - uVar7) &&
                 (*piVar14 == *(int *)(pBVar12 + uVar7))) {
                mEnd = iEnd;
                if (uVar7 < (uint)local_c8) {
                  mEnd = local_80;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar17 + 5),
                                    (BYTE *)((long)(pBVar12 + uVar7) + 4),(BYTE *)iEnd,(BYTE *)mEnd,
                                    local_a8);
                uVar7 = (int)sVar15 + 1;
                if (uVar7 == 0) goto LAB_0013388e;
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar19 = 0x1f;
                  if (uVar7 != 0) {
                    for (; uVar7 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                    }
                  }
                  if ((int)((uVar19 ^ 0x1f) + (int)local_d8 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                    sVar15 = 0;
                    local_d8 = sVar10 + 4;
                    local_b0 = piVar14;
                  }
                }
              }
            }
            local_d0 = 999999999;
            sVar10 = ZSTD_BtFindBestMatch_extDict_selectMLS
                               (pZVar4,(BYTE *)piVar14,(BYTE *)iEnd,&local_d0);
            pZVar4 = local_a0;
            uVar7 = (int)local_d0 + 1;
            if ((uVar7 == 0) || (uVar19 = (int)sVar15 + 1, uVar19 == 0)) goto LAB_0013388e;
            if (sVar10 < 4) {
LAB_0013335f:
              if (local_b8 <= piVar14) break;
              piVar17 = (int *)((long)local_38 + 2);
              uVar7 = (int)local_88 + 2;
              local_88 = (ulong)uVar7;
              if (sVar15 == 0) {
                sVar15 = 0;
              }
              else {
                uVar7 = uVar7 - local_e0;
                pBVar12 = local_90;
                if (uVar7 < (uint)local_c8) {
                  pBVar12 = local_98;
                }
                if (((uint)local_70 < uVar7 && 2 < iVar6 - uVar7) &&
                   (*piVar17 == *(int *)(pBVar12 + uVar7))) {
                  piVar14 = iEnd;
                  if (uVar7 < (uint)local_c8) {
                    piVar14 = local_80;
                  }
                  sVar10 = ZSTD_count_2segments
                                     ((BYTE *)((long)local_38 + 6),
                                      (BYTE *)((long)(pBVar12 + uVar7) + 4),(BYTE *)iEnd,
                                      (BYTE *)piVar14,local_a8);
                  if (sVar10 < 0xfffffffffffffffc) {
                    uVar7 = 0x1f;
                    if (uVar19 != 0) {
                      for (; uVar19 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                      }
                    }
                    if ((int)((uVar7 ^ 0x1f) + (int)local_d8 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
                      sVar15 = 0;
                      local_d8 = sVar10 + 4;
                      local_b0 = piVar17;
                    }
                  }
                }
              }
              local_d0 = 999999999;
              sVar10 = ZSTD_BtFindBestMatch_extDict_selectMLS
                                 (pZVar4,(BYTE *)piVar17,(BYTE *)iEnd,&local_d0);
              uVar7 = (int)local_d0 + 1;
              if ((uVar7 == 0) || (uVar19 = (int)sVar15 + 1, uVar19 == 0)) {
LAB_0013388e:
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x12c2,"U32 ZSTD_highbit32(U32)");
              }
              if (sVar10 < 4) break;
              iVar2 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
                }
              }
              uVar7 = 0x1f;
              if (uVar19 != 0) {
                for (; uVar19 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              if ((int)sVar10 * 4 - iVar2 <= (int)((uVar7 ^ 0x1f) + (int)local_d8 * 4 + -0x18))
              break;
              uVar8 = (uint)local_88;
            }
            else {
              iVar2 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
                }
              }
              uVar7 = 0x1f;
              if (uVar19 != 0) {
                for (; uVar19 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              piVar17 = piVar14;
              uVar8 = local_5c;
              if ((int)sVar10 * 4 - iVar2 <= (int)((uVar7 ^ 0x1f) + (int)local_d8 * 4 + -0x1b))
              goto LAB_0013335f;
            }
            uVar20 = (ulong)uVar8;
            sVar15 = local_d0;
            local_d8 = sVar10;
            local_b0 = piVar17;
          } while (piVar17 < local_b8);
        }
        piVar17 = local_b0;
        if (sVar15 == 0) {
          UVar21 = 1;
        }
        else {
          pBVar13 = (BYTE *)((long)local_b0 + (2 - (long)(local_90 + sVar15)));
          pBVar11 = local_a8;
          pBVar12 = local_90;
          if ((uint)pBVar13 < (uint)local_c8) {
            pBVar11 = local_40;
            pBVar12 = local_98;
          }
          if ((local_78 < local_b0) &&
             (uVar20 = (ulong)pBVar13 & 0xffffffff, pBVar11 < pBVar12 + uVar20)) {
            pBVar12 = pBVar12 + uVar20;
            do {
              piVar14 = (int *)((long)piVar17 + -1);
              pBVar12 = pBVar12 + -1;
              if ((*(BYTE *)piVar14 != *pBVar12) ||
                 (local_d8 = local_d8 + 1, piVar17 = piVar14, piVar14 <= local_78)) break;
            } while (pBVar11 < pBVar12);
          }
          local_bc = local_e0;
          local_e0 = (int)sVar15 - 2;
          UVar21 = (int)sVar15 + 1;
        }
        if (local_68->maxNbSeq <=
            (ulong)((long)local_68->sequences - (long)local_68->sequencesStart >> 3)) {
LAB_001338cc:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_68->maxNbLit) {
LAB_001338ad:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar20 = (long)piVar17 - (long)local_78;
        pBVar12 = local_68->lit;
        if (local_68->litStart + local_68->maxNbLit < pBVar12 + uVar20) {
LAB_001338eb:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar17) {
LAB_0013390a:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < piVar17) {
          ZSTD_safecopyLiterals(pBVar12,(BYTE *)local_78,(BYTE *)piVar17,(BYTE *)local_50);
LAB_001335bd:
          local_68->lit = local_68->lit + uVar20;
          if (0xffff < uVar20) {
            if (local_68->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_68->longLengthID = 1;
            local_68->longLengthPos =
                 (U32)((ulong)((long)local_68->sequences - (long)local_68->sequencesStart) >> 3);
          }
        }
        else {
          uVar3 = *(undefined8 *)(local_78 + 2);
          *(undefined8 *)pBVar12 = *(undefined8 *)local_78;
          *(undefined8 *)(pBVar12 + 8) = uVar3;
          pBVar12 = local_68->lit;
          if (0x10 < uVar20) {
            lVar16 = (long)(pBVar12 + 0x10) - (long)(local_78 + 4);
            if (lVar16 < 8) {
              if (-0x10 < lVar16) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
            }
            else if (0xffffffffffffffe0 < lVar16 - 0x10U) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar3 = *(undefined8 *)(local_78 + 6);
            *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(local_78 + 4);
            *(undefined8 *)(pBVar12 + 0x18) = uVar3;
            if (0x20 < (long)uVar20) {
              lVar16 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_78 + lVar16 + 0x20);
                uVar3 = puVar1[1];
                pBVar11 = pBVar12 + lVar16 + 0x20;
                *(undefined8 *)pBVar11 = *puVar1;
                *(undefined8 *)(pBVar11 + 8) = uVar3;
                puVar1 = (undefined8 *)((long)local_78 + lVar16 + 0x30);
                uVar3 = puVar1[1];
                *(undefined8 *)(pBVar11 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar11 + 0x18) = uVar3;
                lVar16 = lVar16 + 0x20;
              } while (pBVar11 + 0x20 < pBVar12 + uVar20);
            }
            goto LAB_001335bd;
          }
          local_68->lit = pBVar12 + uVar20;
        }
        psVar5 = local_68;
        psVar18 = local_68->sequences;
        psVar18->litLength = (U16)uVar20;
        psVar18->offset = UVar21;
        if (0xffff < local_d8 - 3) {
          if (local_68->longLengthID != 0) {
LAB_00133929:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_68->longLengthID = 2;
          local_68->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)local_68->sequencesStart) >> 3);
        }
        psVar18->matchLength = (U16)(local_d8 - 3);
        psVar18 = psVar18 + 1;
        local_68->sequences = psVar18;
        src = (void *)((long)piVar17 + local_d8);
        piVar17 = (int *)src;
        UVar21 = local_bc;
        UVar9 = local_bc;
        if (src <= local_b8) {
          do {
            uVar19 = UVar9;
            UVar9 = local_e0;
            uVar7 = (uint)((long)src - (long)(local_90 + uVar19));
            pBVar12 = local_90;
            if (uVar7 < (uint)local_c8) {
              pBVar12 = local_98;
            }
            piVar17 = (int *)src;
            UVar21 = uVar19;
            local_e0 = UVar9;
            if (((uVar7 <= (uint)local_70) || (iVar6 - uVar7 < 3)) ||
               (*src != *(int *)(pBVar12 + ((long)src - (long)(local_90 + uVar19) & 0xffffffff))))
            break;
            piVar17 = iEnd;
            if (uVar7 < (uint)local_c8) {
              piVar17 = local_80;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),
                                (BYTE *)((long)(pBVar12 +
                                               ((long)src - (long)(local_90 + uVar19) & 0xffffffff))
                                        + 4),(BYTE *)iEnd,(BYTE *)piVar17,local_a8);
            if (psVar5->maxNbSeq <= (ulong)((long)psVar18 - (long)psVar5->sequencesStart >> 3))
            goto LAB_001338cc;
            if (0x20000 < psVar5->maxNbLit) goto LAB_001338ad;
            pBVar12 = psVar5->lit;
            if (psVar5->litStart + psVar5->maxNbLit < pBVar12) goto LAB_001338eb;
            if (iEnd < src) goto LAB_0013390a;
            if (local_50 < src) {
              ZSTD_safecopyLiterals(pBVar12,(BYTE *)src,(BYTE *)src,(BYTE *)local_50);
            }
            else {
              uVar3 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar12 = *src;
              *(undefined8 *)(pBVar12 + 8) = uVar3;
            }
            psVar18 = psVar5->sequences;
            psVar18->litLength = 0;
            psVar18->offset = 1;
            if (0xffff < sVar10 + 1) {
              if (psVar5->longLengthID != 0) goto LAB_00133929;
              psVar5->longLengthID = 2;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar18->matchLength = (U16)(sVar10 + 1);
            psVar18 = psVar18 + 1;
            psVar5->sequences = psVar18;
            src = (void *)((long)src + sVar10 + 4);
            piVar17 = (int *)src;
            UVar21 = UVar9;
            local_e0 = uVar19;
          } while (src <= local_b8);
        }
      }
    } while (piVar17 < local_b8);
  }
  *local_48 = local_e0;
  local_48[1] = UVar21;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}